

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga.c
# Opt level: O2

void xc_gga_sanity_check(xc_func_info_type *info,int order,xc_gga_out_params *out)

{
  char *__format;
  char *pcVar1;
  size_t sStack_10;
  
  if (4 < (uint)order) {
    fprintf(_stderr,"Order of derivatives \'%d\' not implemented\n",(ulong)(uint)order);
    goto LAB_001cee28;
  }
  if ((out->zk == (double *)0x0) || ((info->flags & 1) != 0)) {
    if (out->vrho == (double *)0x0) {
LAB_001cec0e:
      if (out->v2rho2 == (double *)0x0) {
LAB_001cec35:
        if (out->v3rho3 == (double *)0x0) {
LAB_001cec67:
          if (out->v4rho4 == (double *)0x0) {
            return;
          }
          if ((info->flags & 0x10) != 0) {
            if (out->v4rho3sigma == (double *)0x0) {
              pcVar1 = "error: output variable, out->v4rho3sigma, is a null pointer\n";
            }
            else {
              if (out->v4rho2sigma2 == (double *)0x0) {
                pcVar1 = "error: output variable, out->v4rho2sigma2, is a null pointer\n";
                sStack_10 = 0x3d;
                goto LAB_001cee1f;
              }
              if (out->v4rhosigma3 != (double *)0x0) {
                if (out->v4sigma4 != (double *)0x0) {
                  return;
                }
                pcVar1 = "error: output variable, out->v4sigma4, is a null pointer\n";
                goto LAB_001cee1d;
              }
              pcVar1 = "error: output variable, out->v4rhosigma3, is a null pointer\n";
            }
LAB_001cee08:
            sStack_10 = 0x3c;
            goto LAB_001cee1f;
          }
          pcVar1 = info->name;
          __format = "Functional \'%s\' does not provide an implementation of lxc\n";
        }
        else {
          if ((info->flags & 8) != 0) {
            if (out->v3rho2sigma == (double *)0x0) {
              pcVar1 = "error: output variable, out->v3rho2sigma, is a null pointer\n";
            }
            else {
              if (out->v3rhosigma2 != (double *)0x0) {
                if (out->v3sigma3 == (double *)0x0) {
                  pcVar1 = "error: output variable, out->v3sigma3, is a null pointer\n";
                  goto LAB_001cee1d;
                }
                goto LAB_001cec67;
              }
              pcVar1 = "error: output variable, out->v3rhosigma2, is a null pointer\n";
            }
            goto LAB_001cee08;
          }
          pcVar1 = info->name;
          __format = "Functional \'%s\' does not provide an implementation of kxc\n";
        }
      }
      else {
        if ((info->flags & 4) != 0) {
          if (out->v2rhosigma == (double *)0x0) {
            pcVar1 = "error: output variable, out->v2rhosigma, is a null pointer\n";
            sStack_10 = 0x3b;
            goto LAB_001cee1f;
          }
          if (out->v2sigma2 != (double *)0x0) goto LAB_001cec35;
          pcVar1 = "error: output variable, out->v2sigma2, is a null pointer\n";
LAB_001cee1d:
          sStack_10 = 0x39;
          goto LAB_001cee1f;
        }
        pcVar1 = info->name;
        __format = "Functional \'%s\' does not provide an implementation of fxc\n";
      }
    }
    else {
      if ((info->flags & 2) != 0) {
        if (out->vsigma != (double *)0x0) goto LAB_001cec0e;
        pcVar1 = "error: output variable, out->vsigma, is a null pointer\n";
        sStack_10 = 0x37;
LAB_001cee1f:
        fwrite(pcVar1,sStack_10,1,_stderr);
        goto LAB_001cee28;
      }
      pcVar1 = info->name;
      __format = "Functional \'%s\' does not provide an implementation of vxc\n";
    }
  }
  else {
    pcVar1 = info->name;
    __format = "Functional \'%s\' does not provide an implementation of Exc\n";
  }
  fprintf(_stderr,__format,pcVar1);
LAB_001cee28:
  exit(1);
}

Assistant:

void
xc_gga_sanity_check(const xc_func_info_type *info, int order, xc_gga_out_params *out)
{
  /* sanity check */
  if(order < 0 || order > 4){
    fprintf(stderr, "Order of derivatives '%d' not implemented\n",
	    order);
    exit(1);
  }
  
  /* sanity check */
  if(out->zk != NULL && !(info->flags & XC_FLAGS_HAVE_EXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of Exc\n",
	    info->name);
    exit(1);
  }

  if(out->vrho != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_VXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of vxc\n",
              info->name);
      exit(1);
    }
    check_out_var(vsigma);
  }

  if(out->v2rho2 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_FXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of fxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v2rhosigma); 
    check_out_var(v2sigma2);
  }

  if(out->v3rho3){
    if(!(info->flags & XC_FLAGS_HAVE_KXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of kxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v3rho2sigma);
    check_out_var(v3rhosigma2);
    check_out_var(v3sigma3);
  }

  if(out->v4rho4 != NULL){
    if(!(info->flags & XC_FLAGS_HAVE_LXC)){
      fprintf(stderr, "Functional '%s' does not provide an implementation of lxc\n",
              info->name);
      exit(1);
    }
    check_out_var(v4rho3sigma);
    check_out_var(v4rho2sigma2);
    check_out_var(v4rhosigma3);
    check_out_var(v4sigma4);
  }
}